

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_allocate_large(t_heap<xemmai::t_object> *this,size_t a_size)

{
  int iVar1;
  t_object *p;
  t_object *local_20;
  size_t local_18;
  
  local_18 = a_size;
  local_20 = (t_object *)f_map(a_size);
  local_20->v_count = 1;
  local_20->v_rank = 0x39;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->v_mutex);
  if (iVar1 == 0) {
    std::
    _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
    ::_M_emplace_unique<xemmai::t_object*&,unsigned_long&>
              ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
                *)&this->v_blocks,&local_20,&local_18);
    this->v_allocated = this->v_allocated + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->v_mutex);
    return local_20;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

T* t_heap<T>::f_allocate_large(size_t a_size)
{
	auto p = new(f_map(a_size)) T;
	p->v_rank = c_RANKX;
	{
		std::lock_guard lock(v_mutex);
		v_blocks.emplace(p, a_size);
		++v_allocated;
	}
	return p;
}